

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_merge_if_2_Test::~pass_merge_if_2_Test(pass_merge_if_2_Test *this)

{
  pass_merge_if_2_Test *this_local;
  
  ~pass_merge_if_2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, merge_if_2) {  // NOLINT
                          // this test merge the same if condition
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 2);
    auto &b = mod.var("b", 2);
    auto comb = mod.combinational();
    auto if_ = std::make_shared<IfStmt>(a.eq(constant(1, 2)));
    auto assign1 = b.assign(constant(1, 2));
    if_->add_then_stmt(assign1);
    auto if2 = std::make_shared<IfStmt>(a.eq(constant(2, 2)));
    auto assign2 = b.assign(constant(2, 2));
    if2->add_then_stmt(assign2);
    comb->add_stmt(if_);
    comb->add_stmt(if2);
    auto attr = std::make_shared<Attribute>();
    attr->value_str = "merge_if_block";
    comb->add_attribute(attr);
    merge_if_block(&mod);
    EXPECT_EQ(comb->size(), 1);
    EXPECT_EQ(comb->get_child(0), if_.get());
    EXPECT_EQ(if_->then_body()->size(), 1);
    EXPECT_EQ(if_->else_body()->size(), 1);
    EXPECT_EQ(if_->then_body()->get_child(0), assign1.get());
    EXPECT_EQ(if_->else_body()->get_child(0), if2.get());
}